

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

string * __thiscall pbrt::RGBToSpectrumTable::ToString_abi_cxx11_(RGBToSpectrumTable *this)

{
  ulong uVar1;
  char (*in_RSI) [12];
  string *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char (*args) [12];
  string *fmt;
  
  args = in_RSI;
  fmt = in_RDI;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
  if (in_RSI == sRGB) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,"(sRGB) ");
  }
  else if (in_RSI == DCI_P3) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,"(DCI_P3) ");
  }
  else if (in_RSI == Rec2020) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,"(Rec2020) ");
  }
  else if (in_RSI == ACES2065_1) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffd0,"(ACES2065_1) ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    LogFatal<char_const(&)[12]>(in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)fmt,args);
  }
  StringPrintf<int_const&,std::__cxx11::string&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string RGBToSpectrumTable::ToString() const {
    std::string id;
    if (this == RGBToSpectrumTable::sRGB)
        id = "(sRGB) ";
    else if (this == RGBToSpectrumTable::DCI_P3)
        id = "(DCI_P3) ";
    else if (this == RGBToSpectrumTable::Rec2020)
        id = "(Rec2020) ";
    else if (this == RGBToSpectrumTable::ACES2065_1)
        id = "(ACES2065_1) ";
    CHECK(!id.empty());

    return StringPrintf("[ RGBToSpectrumTable res: %d %s]", res, id);
}